

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapyRateTest.cpp
# Opt level: O2

void runRateTestStreamLoop
               (Device *device,Stream *stream,int direction,size_t numChans,size_t elemSize)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int flags;
  long local_d8;
  longlong timeNs;
  uint local_c4;
  vector<void_*,_std::allocator<void_*>_> buffs;
  long local_98;
  long local_90;
  size_t chanMask;
  int flags_1;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  buffMem;
  longlong timeNs_1;
  
  lVar4 = (**(code **)(*(long *)device + 0x78))();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&buffs,lVar4 * elemSize,
             (allocator_type *)&timeNs);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(&buffMem,numChans,(value_type *)&buffs,(allocator_type *)&chanMask);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&buffs);
  std::vector<void_*,_std::allocator<void_*>_>::vector(&buffs,numChans,(allocator_type *)&timeNs);
  lVar5 = 0;
  for (sVar10 = 0; numChans != sVar10; sVar10 = sVar10 + 1) {
    buffs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_start[sVar10] =
         *(void **)((long)&((buffMem.
                             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5);
    lVar5 = lVar5 + 0x18;
  }
  lVar6 = std::chrono::_V2::system_clock::now();
  lVar5 = std::chrono::_V2::system_clock::now();
  local_90 = std::chrono::_V2::system_clock::now();
  local_98 = std::chrono::_V2::system_clock::now();
  poVar7 = std::operator<<((ostream *)&std::cout,"Starting stream loop, press Ctrl+C to exit...");
  std::endl<char,std::char_traits<char>>(poVar7);
  (**(code **)(*(long *)device + 0x80))(device,stream,0,0,0);
  signal(2,sigIntHandler);
  auVar15._8_4_ = (int)(numChans >> 0x20);
  auVar15._0_8_ = numChans;
  auVar15._12_4_ = 0x45300000;
  auVar16._8_4_ = (int)(elemSize >> 0x20);
  auVar16._0_8_ = elemSize;
  auVar16._12_4_ = 0x45300000;
  uVar11 = 0;
  uVar13 = 0;
  lVar12 = 0;
  iVar1 = 0;
LAB_00109661:
  do {
    if (loopDone != '\0') {
LAB_001098f7:
      (**(code **)(*(long *)device + 0x88))(device,stream,0,0);
      std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                (&buffs.super__Vector_base<void_*,_std::allocator<void_*>_>);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::~vector(&buffMem);
      return;
    }
    flags = 0;
    timeNs = 0;
    local_d8 = lVar5;
    if (direction == 0) {
      uVar2 = (**(code **)(*(long *)device + 0x98))
                        (device,stream,
                         buffs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start,lVar4,&flags,0,100000);
LAB_001096ed:
      lVar5 = local_d8;
      if (uVar2 == 0xfffffff9) {
        uVar13 = uVar13 + 1;
      }
      else if (uVar2 != 0xffffffff) {
        if (uVar2 != 0xfffffffc) {
          if (-1 < (int)uVar2) goto LAB_00109722;
          poVar7 = std::operator<<((ostream *)&std::cerr,"Unexpected stream error ");
          pcVar9 = (char *)SoapySDR::errToStr(uVar2);
          poVar7 = std::operator<<(poVar7,pcVar9);
          std::endl<char,std::char_traits<char>>(poVar7);
          goto LAB_001098f7;
        }
        uVar11 = uVar11 + 1;
      }
      goto LAB_00109661;
    }
    uVar2 = 0;
    if (direction == 1) {
      uVar2 = (**(code **)(*(long *)device + 0x90))
                        (device,stream,
                         buffs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start,lVar4,&flags,&timeNs,100000);
      goto LAB_001096ed;
    }
LAB_00109722:
    local_c4 = uVar2;
    lVar8 = std::chrono::_V2::system_clock::now();
    if (local_90 + 300000000 < lVar8) {
      printf("\b%c",(ulong)(uint)(int)"|/-\\"[iVar1 % 4]);
      fflush(_stdout);
      local_90 = lVar8;
      iVar1 = iVar1 + 1;
    }
    if (local_98 + 1000000000 < lVar8) {
      while( true ) {
        do {
          while (iVar3 = (**(code **)(*(long *)device + 0xa0))
                                   (device,stream,&chanMask,&flags_1,&timeNs_1), iVar3 == -7) {
            uVar13 = uVar13 + 1;
          }
        } while (iVar3 == -6);
        local_98 = lVar8;
        if (iVar3 != -4) break;
        uVar11 = uVar11 + 1;
      }
    }
    lVar12 = lVar12 + (ulong)local_c4;
    lVar5 = local_d8;
    if (local_d8 + 5000000000 < lVar8) {
      auVar17._8_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar17._0_8_ = lVar12;
      auVar17._12_4_ = 0x45300000;
      dVar14 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) /
               (double)((lVar8 - lVar6) / 1000);
      printf("\b%g Msps\t%g MBps",dVar14,
             dVar14 * ((auVar15._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)numChans) - 4503599627370496.0)) *
             ((auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)elemSize) - 4503599627370496.0)),lVar12,
             (lVar8 - lVar6) % 1000);
      if (uVar11 != 0) {
        printf("\tOverflows %u",(ulong)uVar11);
      }
      if (uVar13 != 0) {
        printf("\tUnderflows %u",(ulong)uVar13);
      }
      printf("\n ");
      lVar5 = lVar8;
    }
  } while( true );
}

Assistant:

void runRateTestStreamLoop(
    SoapySDR::Device *device,
    SoapySDR::Stream *stream,
    const int direction,
    const size_t numChans,
    const size_t elemSize)
{
    //allocate buffers for the stream read/write
    const size_t numElems = device->getStreamMTU(stream);
    std::vector<std::vector<char>> buffMem(numChans, std::vector<char>(elemSize*numElems));
    std::vector<void *> buffs(numChans);
    for (size_t i = 0; i < numChans; i++) buffs[i] = buffMem[i].data();

    //state collected in this loop
    unsigned int overflows(0);
    unsigned int underflows(0);
    unsigned long long totalSamples(0);
    const auto startTime = std::chrono::high_resolution_clock::now();
    auto timeLastPrint = std::chrono::high_resolution_clock::now();
    auto timeLastSpin = std::chrono::high_resolution_clock::now();
    auto timeLastStatus = std::chrono::high_resolution_clock::now();
    int spinIndex(0);

    std::cout << "Starting stream loop, press Ctrl+C to exit..." << std::endl;
    device->activateStream(stream);
    signal(SIGINT, sigIntHandler);
    while (not loopDone)
    {
        int ret(0);
        int flags(0);
        long long timeNs(0);
        switch(direction)
        {
        case SOAPY_SDR_RX:
            ret = device->readStream(stream, buffs.data(), numElems, flags, timeNs);
            break;
        case SOAPY_SDR_TX:
            ret = device->writeStream(stream, buffs.data(), numElems, flags, timeNs);
            break;
        }

        if (ret == SOAPY_SDR_TIMEOUT) continue;
        if (ret == SOAPY_SDR_OVERFLOW)
        {
            overflows++;
            continue;
        }
        if (ret == SOAPY_SDR_UNDERFLOW)
        {
            underflows++;
            continue;
        }
        if (ret < 0)
        {
            std::cerr << "Unexpected stream error " << SoapySDR::errToStr(ret) << std::endl;
            break;
        }
        totalSamples += ret;

        const auto now = std::chrono::high_resolution_clock::now();
        if (timeLastSpin + std::chrono::milliseconds(300) < now)
        {
            timeLastSpin = now;
            static const char spin[] = {"|/-\\"};
            printf("\b%c", spin[(spinIndex++)%4]);
            fflush(stdout);
        }
        //occasionally read out the stream status (non blocking)
        if (timeLastStatus + std::chrono::seconds(1) < now)
        {
            timeLastStatus = now;
            while (true)
            {
                size_t chanMask; int flags; long long timeNs;
                ret = device->readStreamStatus(stream, chanMask, flags, timeNs, 0);
                if (ret == SOAPY_SDR_OVERFLOW) overflows++;
                else if (ret == SOAPY_SDR_UNDERFLOW) underflows++;
                else if (ret == SOAPY_SDR_TIME_ERROR) {}
                else break;
            }
        }
        if (timeLastPrint + std::chrono::seconds(5) < now)
        {
            timeLastPrint = now;
            const auto timePassed = std::chrono::duration_cast<std::chrono::microseconds>(now - startTime);
            const auto sampleRate = double(totalSamples)/timePassed.count();
            printf("\b%g Msps\t%g MBps", sampleRate, sampleRate*numChans*elemSize);
            if (overflows != 0) printf("\tOverflows %u", overflows);
            if (underflows != 0) printf("\tUnderflows %u", underflows);
            printf("\n ");
        }

    }
    device->deactivateStream(stream);
}